

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall
lume::Mesh::insert<std::__detail::_Node_iterator<lume::Grob,true,false>>
          (Mesh *this,_Node_iterator<lume::Grob,_true,_false> begin,
          _Node_iterator<lume::Grob,_true,_false> end)

{
  _Node_iterator<lume::Grob,_true,_false> i;
  
  for (; begin.super__Node_iterator_base<lume::Grob,_false>._M_cur !=
         end.super__Node_iterator_base<lume::Grob,_false>._M_cur;
      begin.super__Node_iterator_base<lume::Grob,_false>._M_cur =
           (_Node_iterator_base<lume::Grob,_false>)
           (((__node_type *)begin.super__Node_iterator_base<lume::Grob,_false>._M_cur)->
           super__Hash_node_base)._M_nxt) {
    insert(this,(Grob *)&((__node_type *)begin.super__Node_iterator_base<lume::Grob,_false>._M_cur)
                         ->super__Hash_node_value<lume::Grob,_false>);
  }
  return;
}

Assistant:

void insert (const iter_t begin, const iter_t end)
	{
		for (iter_t i = begin; i != end; ++i)
			insert (*i);
	}